

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O2

void __thiscall
njoy::ENDFtk::section::BaseWithoutMT<njoy::ENDFtk::section::Type<1,_458>_>::BaseWithoutMT
          (BaseWithoutMT<njoy::ENDFtk::section::Type<1,_458>_> *this,int ZA,double AWR)

{
  undefined8 *puVar1;
  char *in_stack_ffffffffffffffe8;
  
  this->ZA_ = ZA;
  this->atomicWeightRatio_ = AWR;
  if (ZA < 1) {
    tools::Log::error<char_const*>(in_stack_ffffffffffffffe8);
    tools::Log::info<char_const*>(in_stack_ffffffffffffffe8);
    tools::Log::info<char_const*,int>("Encountered ZA number: {}",ZA);
  }
  else {
    if (0.0 <= AWR) {
      return;
    }
    tools::Log::error<char_const*>(in_stack_ffffffffffffffe8);
    tools::Log::info<char_const*>(in_stack_ffffffffffffffe8);
    tools::Log::info<char_const*,double>("Encountered atomic mass ratio: {}",AWR);
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = getenv;
  __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

BaseWithoutMT( int ZA, double AWR ) :
  ZA_( ZA ), atomicWeightRatio_( AWR ) {

  if ( ZA < 1 ) {

    Log::error( "Illegal ZA number" );
    Log::info( "ZA numbers must be greater than zero" );
    Log::info( "Encountered ZA number: {}", ZA );
    throw std::exception();
  }
  if ( AWR < 0.0 ) {

    Log::error( "Illegal atomic mass ratio" );
    Log::info( "atomic mass ratio numbers must be greater than zero" );
    Log::info( "Encountered atomic mass ratio: {}", AWR );
    throw std::exception();
  }
}